

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::OP_InitBaseClass
          (InterpreterStackFrame *this,FrameDisplay *environment,FunctionInfoPtrPtr infoRef,
          RegSlot protoReg)

{
  JavascriptLibrary *pJVar1;
  DynamicObject *protoParent_00;
  DynamicObject *constructorParent_00;
  Var pvVar2;
  RecyclableObject *constructorParent;
  RecyclableObject *protoParent;
  RegSlot protoReg_local;
  FunctionInfoPtrPtr infoRef_local;
  FrameDisplay *environment_local;
  InterpreterStackFrame *this_local;
  
  pJVar1 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  protoParent_00 = JavascriptLibraryBase::GetObjectPrototype(&pJVar1->super_JavascriptLibraryBase);
  pJVar1 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  constructorParent_00 =
       JavascriptLibraryBase::GetFunctionPrototype(&pJVar1->super_JavascriptLibraryBase);
  pvVar2 = InitClassHelper(this,environment,infoRef,&protoParent_00->super_RecyclableObject,
                           &constructorParent_00->super_RecyclableObject,protoReg);
  return pvVar2;
}

Assistant:

Var InterpreterStackFrame::OP_InitBaseClass(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, RegSlot protoReg)
    {
        RecyclableObject * protoParent = scriptContext->GetLibrary()->GetObjectPrototype();
        RecyclableObject * constructorParent = scriptContext->GetLibrary()->GetFunctionPrototype();

        return InitClassHelper(environment, infoRef, protoParent, constructorParent, protoReg);
    }